

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void google::protobuf::internal::VerifyVersion
               (int headerVersion,int minLibraryVersion,char *filename)

{
  string *psVar1;
  int version;
  int version_00;
  int version_01;
  int version_02;
  undefined1 local_a0 [56];
  string local_68;
  string local_48;
  
  if (0x2df5a4 < minLibraryVersion) {
    LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/common.cc"
               ,0x4c);
    psVar1 = (string *)(local_a0 + 0x18);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_68,(internal *)(ulong)(uint)minLibraryVersion,version);
    std::__cxx11::string::append(psVar1);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_48,(internal *)0x2df5a4,version_00);
    std::__cxx11::string::append(psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    LogMessage::Finish((LogMessage *)local_a0);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    LogMessage::~LogMessage((LogMessage *)local_a0);
  }
  if (headerVersion < 0x2df5a0) {
    LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/common.cc"
               ,0x57);
    psVar1 = (string *)(local_a0 + 0x18);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_68,(internal *)(ulong)(uint)headerVersion,version_01);
    std::__cxx11::string::append(psVar1);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_48,(internal *)0x2df5a4,version_02);
    std::__cxx11::string::append(psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    LogMessage::Finish((LogMessage *)local_a0);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    LogMessage::~LogMessage((LogMessage *)local_a0);
  }
  return;
}

Assistant:

void VerifyVersion(int headerVersion,
                   int minLibraryVersion,
                   const char* filename) {
  if (GOOGLE_PROTOBUF_VERSION < minLibraryVersion) {
    // Library is too old for headers.
    GOOGLE_LOG(FATAL)
      << "This program requires version " << VersionString(minLibraryVersion)
      << " of the Protocol Buffer runtime library, but the installed version "
         "is " << VersionString(GOOGLE_PROTOBUF_VERSION) << ".  Please update "
         "your library.  If you compiled the program yourself, make sure that "
         "your headers are from the same version of Protocol Buffers as your "
         "link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
  if (headerVersion < kMinHeaderVersionForLibrary) {
    // Headers are too old for library.
    GOOGLE_LOG(FATAL)
      << "This program was compiled against version "
      << VersionString(headerVersion) << " of the Protocol Buffer runtime "
         "library, which is not compatible with the installed version ("
      << VersionString(GOOGLE_PROTOBUF_VERSION) <<  ").  Contact the program "
         "author for an update.  If you compiled the program yourself, make "
         "sure that your headers are from the same version of Protocol Buffers "
         "as your link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
}